

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlOutputBufferPtrWrap(xmlOutputBufferPtr buffer)

{
  PyObject *ret;
  xmlOutputBufferPtr buffer_local;
  
  if (buffer == (xmlOutputBufferPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    buffer_local = (xmlOutputBufferPtr)&_Py_NoneStruct;
  }
  else {
    buffer_local = (xmlOutputBufferPtr)PyCapsule_New(buffer,"xmlOutputBufferPtr",0);
  }
  return (PyObject *)buffer_local;
}

Assistant:

PyObject *
libxml_xmlOutputBufferPtrWrap(xmlOutputBufferPtr buffer)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlOutputBufferPtrWrap: buffer = %p\n", buffer);
#endif
    if (buffer == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) buffer,
                                     (char *) "xmlOutputBufferPtr", NULL);
    return (ret);
}